

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall duckdb::CSVReaderOptions::SetQuote(CSVReaderOptions *this,string *quote_p)

{
  InvalidInputException *this_00;
  allocator local_59;
  string local_58;
  string quote_str;
  
  ::std::__cxx11::string::string((string *)&quote_str,(string *)quote_p);
  if (quote_str._M_string_length < 2) {
    if (quote_str._M_string_length == 0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58.field_2._M_allocated_capacity._0_2_ = 0;
      local_58._M_string_length = 1;
      ::std::__cxx11::string::operator=((string *)&quote_str,(string *)&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
    }
    if ((this->dialect_options).state_machine_options.quote.set_by_user == false) {
      (this->dialect_options).state_machine_options.quote.value = *quote_str._M_dataplus._M_p;
      (this->dialect_options).state_machine_options.quote.set_by_user = true;
    }
    ::std::__cxx11::string::~string((string *)&quote_str);
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_58,"The quote option cannot exceed a size of 1 byte.",&local_59);
  InvalidInputException::InvalidInputException(this_00,&local_58);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CSVReaderOptions::SetQuote(const string &quote_p) {
	auto quote_str = quote_p;
	if (quote_str.size() > 1) {
		throw InvalidInputException("The quote option cannot exceed a size of 1 byte.");
	}
	if (quote_str.empty()) {
		quote_str = string("\0", 1);
	}
	this->dialect_options.state_machine_options.quote.Set(quote_str[0]);
}